

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dokick.c
# Opt level: O3

void impact_drop(obj *missile,xchar x,xchar y,xchar dlev)

{
  int iVar1;
  int iVar2;
  obj *poVar3;
  level *lev;
  monst *mtmp;
  schar loc;
  boolean bVar4;
  boolean bVar5;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  char *pcVar11;
  undefined7 in_register_00000011;
  char cVar12;
  undefined7 in_register_00000031;
  char *pcVar13;
  obj *obj;
  bool bVar14;
  bool peaceful;
  byte local_8f;
  coord local_82;
  long local_80;
  long local_78;
  long local_70;
  monst *local_68;
  int local_5c;
  int local_58;
  int local_54;
  long local_50;
  long local_48;
  char *local_40;
  long local_38;
  
  lVar10 = (long)(int)CONCAT71(in_register_00000031,x);
  local_48 = (long)(int)CONCAT71(in_register_00000011,y);
  if (level->objects[lVar10][local_48] == (obj *)0x0) {
    return;
  }
  local_38 = lVar10;
  loc = down_gate(x,y);
  drop_to(&local_82,loc);
  if (local_82.y == 0) {
    return;
  }
  uVar9 = (uint)(byte)dlev;
  if (dlev == '\0') {
    uVar9 = (uint)(byte)local_82.y;
  }
  local_80 = CONCAT44(local_80._4_4_,uVar9);
  cVar12 = '\t';
  if (dlev == '\0') {
    cVar12 = loc;
  }
  bVar4 = costly_spot(x,y);
  lev = level;
  bVar14 = true;
  if (bVar4 != '\0') {
    pcVar7 = in_rooms(level,x,y,0x12);
    local_68 = shop_keeper(lev,*pcVar7);
    if (local_68 != (monst *)0x0) {
      local_78 = (long)*(int *)&local_68[0x1b].field_0x60;
      iVar1._0_1_ = local_68[0x1b].mtame;
      iVar1._1_1_ = local_68[0x1b].m_ap_type;
      iVar1._2_1_ = local_68[0x1b].mfrozen;
      iVar1._3_1_ = local_68[0x1b].mblinded;
      local_70 = (long)iVar1;
      local_8f = (local_68->field_0x62 & 0x40) >> 6;
      goto LAB_0017b2d1;
    }
  }
  local_78 = 0;
  local_70 = 0;
  local_8f = 1;
  local_68 = (monst *)0x0;
LAB_0017b2d1:
  if (missile != (obj *)0x0) {
    bVar14 = missile->otyp != 0x213;
  }
  obj = level->objects[lVar10][local_48];
  if (obj != (obj *)0x0) {
    local_54 = (int)cVar12;
    lVar10 = 0;
    local_58 = (int)local_82.x;
    local_5c = (int)(char)local_80;
    local_40 = u.urooms;
    local_80 = 0;
    local_50 = 0;
    do {
      poVar3 = (obj->v).v_nexthere;
      if ((((obj != missile) && (lVar10 = lVar10 + obj->quan, obj != uball)) && (obj != uchain)) &&
         (((obj->field_0x4b & 0x20) == 0 || ((ushort)(obj->otyp - 0xdaU) < 3)))) {
        if (bVar14) {
          uVar9 = 3;
          if (obj->otyp == 0x214) {
            uVar9 = 0x1e;
          }
        }
        else {
          uVar9 = 3;
          if (obj->otyp == 0x214) goto LAB_0017b4a9;
        }
        uVar6 = mt_random();
        if (uVar6 % uVar9 == 0) {
          obj_extract_self(obj);
          lVar8 = local_80;
          if (bVar4 != '\0') {
            bVar5 = costly_spot(u.ux,u.uy);
            if (bVar5 == '\0') {
              peaceful = false;
            }
            else {
              pcVar7 = in_rooms(level,x,y,0x12);
              pcVar7 = strchr(local_40,(int)*pcVar7);
              peaceful = pcVar7 != (char *)0x0;
            }
            lVar8 = stolen_value(obj,x,y,peaceful,'\x01');
            if (obj->cobj != (obj *)0x0) {
              picked_container(obj);
            }
            lVar8 = lVar8 + local_80;
            if (obj->oclass != '\f') {
              obj->field_0x4a = obj->field_0x4a & 0xf7;
            }
          }
          deliver_object(obj,(xchar)local_58,(xchar)local_5c,local_54);
          local_50 = local_50 + obj->quan;
          local_80 = lVar8;
        }
      }
LAB_0017b4a9:
      obj = poVar3;
    } while (poVar3 != (obj *)0x0);
    if ((local_50 != 0) && ((viz_array[local_48][local_38] & 2U) != 0)) {
      pcVar7 = "object falls";
      if (local_50 != 1) {
        pcVar7 = "objects fall";
      }
      if (missile == (obj *)0x0) {
        if (lVar10 == local_50) {
          pcVar11 = "All the";
          if (local_50 == 1) {
            pcVar11 = "The";
          }
        }
        else {
          pcVar11 = "Some of the";
          pcVar7 = "objects fall";
          if (local_50 == 1) {
            pcVar11 = "One of the";
            pcVar7 = "objects falls";
          }
        }
        pline("%s adjacent %s %s.",pcVar11,pcVar7,gate_str);
      }
      else {
        pcVar11 = "";
        if (local_50 == 1) {
          pcVar11 = "an";
        }
        pcVar13 = "the ";
        if (local_50 != lVar10) {
          pcVar13 = pcVar11;
        }
        pline("From the impact, %sother %s.",pcVar13,pcVar7);
      }
    }
    mtmp = local_68;
    lVar10 = local_80;
    if (((bVar4 != '\0') && (local_68 != (monst *)0x0)) && (local_80 != 0)) {
      iVar2._0_1_ = local_68[0x1b].mtame;
      iVar2._1_1_ = local_68[0x1b].m_ap_type;
      iVar2._2_1_ = local_68[0x1b].mfrozen;
      iVar2._3_1_ = local_68[0x1b].mblinded;
      if (local_70 < iVar2) {
        pcVar7 = currency(local_80);
        pline("You removed %ld %s worth of goods!",lVar10,pcVar7);
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
          You_hear("a scream, \"Thief!\"");
        }
        else {
          if (mtmp[0x1b].field_0x75 == '\0') {
            strncpy(&mtmp[0x1b].field_0x75,plname,0x20);
          }
          if (local_8f == 0) {
            pcVar7 = Monnam(mtmp);
            pcVar11 = "%s is infuriated!";
          }
          else {
            pcVar11 = "\"%s, you are a thief!\"";
            pcVar7 = plname;
          }
          pline(pcVar11,pcVar7);
        }
        hot_pursuit(mtmp);
        angry_guards('\0');
        return;
      }
      lVar10 = *(int *)&local_68[0x1b].field_0x60 - local_78;
      if (lVar10 != 0 && local_78 <= *(int *)&local_68[0x1b].field_0x60) {
        pcVar7 = Monnam(local_68);
        pcVar11 = currency(lVar10);
        pline("You owe %s %ld %s for goods lost.",pcVar7,lVar10,pcVar11);
        return;
      }
    }
  }
  return;
}

Assistant:

void impact_drop(struct obj *missile, xchar x, xchar y, xchar dlev)
{
	schar toloc;
	struct obj *obj, *obj2;
	struct monst *shkp;
	long oct, dct, price, debit, robbed;
	boolean angry, costly, isrock;
	coord cc;

	if (!OBJ_AT(x, y)) return;

	toloc = down_gate(x, y);
	drop_to(&cc, toloc);
	if (!cc.y) return;

	if (dlev) {
		/* send objects next to player falling through trap door.
		 * checked in obj_delivery().
		 */
		toloc = MIGR_NEAR_PLAYER;
		cc.y = dlev;
	}

	costly = costly_spot(x, y);
	price = debit = robbed = 0L;
	angry = FALSE;
	shkp = NULL;
	/* if 'costly', we must keep a record of ESHK(shkp) before
	 * it undergoes changes through the calls to stolen_value.
	 * the angry bit must be reset, if needed, in this fn, since
	 * stolen_value is called under the 'silent' flag to avoid
	 * unsavory pline repetitions.
	 */
	if (costly) {
	    if ((shkp = shop_keeper(level, *in_rooms(level, x, y, SHOPBASE))) != 0) {
		debit	= ESHK(shkp)->debit;
		robbed	= ESHK(shkp)->robbed;
		angry	= !shkp->mpeaceful;
	    }
	}

	isrock = (missile && missile->otyp == ROCK);
	oct = dct = 0L;
	for (obj = level->objects[x][y]; obj; obj = obj2) {
		obj2 = obj->nexthere;
		if (obj == missile) continue;
		/* number of objects in the pile */
		oct += obj->quan;
		if (obj == uball || obj == uchain) continue;
		/* level prizes never fall */
		if (Is_prize(obj)) continue;
		/* boulders can fall too, but rarely & never due to rocks */
		if ((isrock && obj->otyp == BOULDER) ||
		   rn2(obj->otyp == BOULDER ? 30 : 3)) continue;
		obj_extract_self(obj);

		if (costly) {
		    price += stolen_value(obj, x, y,
				(costly_spot(u.ux, u.uy) &&
				 strchr(u.urooms, *in_rooms(level, x, y, SHOPBASE))),
				TRUE);
		    /* set obj->no_charge to 0 */
		    if (Has_contents(obj))
			picked_container(obj);	/* does the right thing */
		    if (obj->oclass != COIN_CLASS)
			obj->no_charge = 0;
		}

		deliver_object(obj, cc.x, cc.y, toloc);

		/* number of fallen objects */
		dct += obj->quan;
	}

	if (dct && cansee(x,y)) {	/* at least one object fell */
	    const char *what = (dct == 1L ? "object falls" : "objects fall");

	    if (missile)
		pline("From the impact, %sother %s.",
		      dct == oct ? "the " : dct == 1L ? "an" : "", what);
	    else if (oct == dct)
		pline("%s adjacent %s %s.",
		      dct == 1L ? "The" : "All the", what, gate_str);
	    else
		pline("%s adjacent %s %s.",
		      dct == 1L ? "One of the" : "Some of the",
		      dct == 1L ? "objects falls" : what, gate_str);
	}

	if (costly && shkp && price) {
		if (ESHK(shkp)->robbed > robbed) {
		    pline("You removed %ld %s worth of goods!", price, currency(price));
		    if (cansee(shkp->mx, shkp->my)) {
			if (ESHK(shkp)->customer[0] == 0)
			    strncpy(ESHK(shkp)->customer,
					   plname, PL_NSIZ);
			if (angry)
			    pline("%s is infuriated!", Monnam(shkp));
			else pline("\"%s, you are a thief!\"", plname);
		    } else  You_hear("a scream, \"Thief!\"");
		    hot_pursuit(shkp);
		    angry_guards(FALSE);
		    return;
		}
		if (ESHK(shkp)->debit > debit) {
		    long amt = (ESHK(shkp)->debit - debit);
		    pline("You owe %s %ld %s for goods lost.",
			Monnam(shkp),
			amt, currency(amt));
		}
	}

}